

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc_lat.c
# Opt level: O3

int main(int argc,char **argv)

{
  size_t __n;
  int iVar1;
  int iVar2;
  int iVar3;
  void *__s;
  uint64_t uVar4;
  undefined1 auVar5 [16];
  int w;
  nn_stopwatch stopwatch;
  nn_thread thread;
  int local_54;
  nn_stopwatch local_50;
  double local_48;
  double dStack_40;
  nn_thread local_38;
  
  if (argc == 3) {
    iVar1 = atoi(argv[1]);
    message_size = (size_t)iVar1;
    roundtrip_count = atoi(argv[2]);
    iVar2 = nn_socket(1,0x10);
    if (iVar2 == -1) {
      __assert_fail("s != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                    ,0x55,"int main(int, char **)");
    }
    iVar1 = nn_bind(iVar2,"inproc://inproc_lat");
    if (iVar1 < 0) {
      __assert_fail("rc >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                    ,0x57,"int main(int, char **)");
    }
    local_54 = nn_socket(1,0x10);
    if (local_54 == -1) {
      __assert_fail("w != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                    ,0x5a,"int main(int, char **)");
    }
    iVar1 = nn_connect(local_54,"inproc://inproc_lat");
    __n = message_size;
    if (iVar1 < 0) {
      __assert_fail("rc >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                    ,0x5c,"int main(int, char **)");
    }
    __s = malloc(message_size);
    if (__s == (void *)0x0) {
      __assert_fail("buf",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                    ,0x5f,"int main(int, char **)");
    }
    memset(__s,0x6f,__n);
    nn_thread_init(&local_38,worker,&local_54);
    nn_sleep(100);
    nn_stopwatch_init(&local_50);
    if (roundtrip_count != 0) {
      iVar1 = 0;
      do {
        iVar3 = nn_send(iVar2,__s,message_size,0);
        if (iVar3 != (int)message_size) {
          __assert_fail("rc == (int)message_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                        ,0x6a,"int main(int, char **)");
        }
        iVar3 = nn_recv(iVar2,__s);
        if (iVar3 != (int)message_size) {
          __assert_fail("rc == (int)message_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                        ,0x6c,"int main(int, char **)");
        }
        iVar1 = iVar1 + 1;
      } while (iVar1 != roundtrip_count);
    }
    uVar4 = nn_stopwatch_term(&local_50);
    auVar5._8_4_ = (int)(uVar4 >> 0x20);
    auVar5._0_8_ = uVar4;
    auVar5._12_4_ = 0x45300000;
    dStack_40 = auVar5._8_8_ - 1.9342813113834067e+25;
    local_48 = (dStack_40 + ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) /
               (double)(roundtrip_count * 2);
    iVar1 = 0;
    printf("message size: %d [B]\n",message_size & 0xffffffff);
    printf("roundtrip count: %d\n",(ulong)(uint)roundtrip_count);
    printf("average latency: %.3f [us]\n");
    nn_thread_term(&local_38);
    free(__s);
    iVar2 = nn_close(iVar2);
    if (iVar2 != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                    ,0x79,"int main(int, char **)");
    }
    iVar2 = nn_close(local_54);
    if (iVar2 != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/perf/inproc_lat.c"
                    ,0x7b,"int main(int, char **)");
    }
  }
  else {
    puts("usage: inproc_lat <message-size> <roundtrip-count>");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main (int argc, char *argv [])
{
    int rc;
    int s;
    int w;
    int i;
    char *buf;
    struct nn_thread thread;
    struct nn_stopwatch stopwatch;
    uint64_t elapsed;
    double latency;

    if (argc != 3) {
        printf ("usage: inproc_lat <message-size> <roundtrip-count>\n");
        return 1;
    }

    message_size = atoi (argv [1]);
    roundtrip_count = atoi (argv [2]);

    s = nn_socket (AF_SP, NN_PAIR);
    assert (s != -1);
    rc = nn_bind (s, "inproc://inproc_lat");
    assert (rc >= 0);

    w = nn_socket (AF_SP, NN_PAIR);
    assert (w != -1);
    rc = nn_connect (w, "inproc://inproc_lat");
    assert (rc >= 0);

    buf = malloc (message_size);
    assert (buf);
    memset (buf, 111, message_size);

    /*  Wait a bit till the worker thread blocks in nn_recv(). */
    nn_thread_init (&thread, worker, &w);
    nn_sleep (100);

    nn_stopwatch_init (&stopwatch);

    for (i = 0; i != roundtrip_count; i++) {
        rc = nn_send (s, buf, message_size, 0);
        assert (rc == (int)message_size);
        rc = nn_recv (s, buf, message_size, 0);
        assert (rc == (int)message_size);
    }

    elapsed = nn_stopwatch_term (&stopwatch);

    latency = (double) elapsed / (roundtrip_count * 2);
    printf ("message size: %d [B]\n", (int) message_size);
    printf ("roundtrip count: %d\n", (int) roundtrip_count);
    printf ("average latency: %.3f [us]\n", (double) latency);

    nn_thread_term (&thread);
    free (buf);
    rc = nn_close (s);
    assert (rc == 0);
    rc = nn_close (w);
    assert (rc == 0);

    return 0;
}